

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatareader.cpp
# Opt level: O0

ssize_t icu_63::CollationDataReader::read(int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  CollationData *this;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  MaxVariable MVar7;
  uint32_t uVar8;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  UTrie2 *pUVar9;
  undefined7 extraout_var_01;
  UnicodeSet *pUVar10;
  undefined7 extraout_var_02;
  ushort *puVar11;
  undefined4 extraout_var_03;
  CollationSettings *pCVar12;
  CollationTailoring *in_RCX;
  size_t size;
  undefined4 in_register_0000003c;
  CollationTailoring *this_00;
  CollationSettings *in_R8;
  bool bVar13;
  UnicodeSet *local_458;
  CollationData *local_448;
  CollationSettings *settings;
  uint16_t local_428 [2];
  int32_t fastLatinOptions;
  uint16_t fastLatinPrimaries [384];
  int32_t options;
  CollationSettings *ts;
  int32_t scriptsLength;
  uint16_t *scripts;
  UChar32 UStack_f8;
  UChar lead;
  UChar32 c;
  UChar32 end;
  UChar32 start;
  int32_t i;
  int32_t count;
  uint16_t *unsafeData;
  USerializedSet sset;
  uint32_t secTerBoundaries;
  uint32_t commonSecTer;
  int32_t jamoCE32sStart;
  CollationData *data;
  uint8_t *reorderTable;
  uint32_t *puStack_78;
  int32_t reorderRangesLength;
  uint32_t *reorderRanges;
  int32_t *piStack_68;
  int32_t reorderCodesLength;
  int32_t *reorderCodes;
  CollationData *baseData;
  int32_t length;
  int32_t offset;
  int32_t index;
  int32_t indexesLength;
  int32_t *inIndexes;
  int32_t headerLength;
  DataHeader *header;
  UErrorCode *errorCode_local;
  CollationTailoring *tailoring_local;
  uint *puStack_18;
  int32_t inLength_local;
  uint8_t *inBytes_local;
  CollationTailoring *base_local;
  
  this_00 = (CollationTailoring *)CONCAT44(in_register_0000003c,__fd);
  tailoring_local._4_4_ = (int)__nbytes;
  UVar2 = ::U_FAILURE(*(UErrorCode *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject);
  if (UVar2 != '\0') {
    return CONCAT71(extraout_var,UVar2);
  }
  puStack_18 = (uint *)__buf;
  if (this_00 != (CollationTailoring *)0x0) {
    if ((__buf == (void *)0x0) || ((-1 < tailoring_local._4_4_ && (tailoring_local._4_4_ < 0x18))))
    {
      *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 1;
      return (ssize_t)in_R8;
    }
    if (((*(char *)((long)__buf + 2) != -0x26) || (*(char *)((long)__buf + 3) != '\'')) ||
       (UVar2 = isAcceptable(in_RCX->version,(char *)0x0,(char *)0x0,(UDataInfo *)((long)__buf + 4))
       , UVar2 == '\0')) {
      *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
      return (ssize_t)in_R8;
    }
    iVar3 = CollationTailoring::getUCAVersion(this_00);
    iVar4 = CollationTailoring::getUCAVersion(in_RCX);
    if (iVar3 != iVar4) {
      *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 0x1c;
      return (ssize_t)in_R8;
    }
    puStack_18 = (uint *)((long)__buf + (long)(int)(uint)*__buf);
    if (-1 < tailoring_local._4_4_) {
      tailoring_local._4_4_ = tailoring_local._4_4_ - (uint)*__buf;
    }
  }
  pCVar12 = in_R8;
  if ((puStack_18 == (uint *)0x0) || ((-1 < tailoring_local._4_4_ && (tailoring_local._4_4_ < 8))))
  {
    *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 1;
  }
  else {
    uVar1 = *puStack_18;
    if (((int)uVar1 < 2) ||
       ((-1 < tailoring_local._4_4_ && (tailoring_local._4_4_ < (int)(uVar1 * 4))))) {
      *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
    }
    else {
      if ((int)uVar1 < 0x14) {
        if ((int)uVar1 < 6) {
          baseData._0_4_ = 0;
        }
        else {
          baseData._0_4_ = puStack_18[(int)(uVar1 - 1)];
        }
      }
      else {
        baseData._0_4_ = puStack_18[0x13];
      }
      if ((tailoring_local._4_4_ < 0) || ((int)(uint)baseData <= tailoring_local._4_4_)) {
        if (this_00 == (CollationTailoring *)0x0) {
          local_448 = (CollationData *)0x0;
        }
        else {
          local_448 = this_00->data;
        }
        piStack_68 = (int32_t *)0x0;
        reorderRanges._4_4_ = 0;
        puStack_78 = (uint32_t *)0x0;
        reorderTable._4_4_ = 0;
        iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,5);
        iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,6);
        if (3 < iVar4 - iVar3) {
          if (local_448 == (CollationData *)0x0) {
            *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
            return (ssize_t)in_R8;
          }
          piStack_68 = (int32_t *)((long)puStack_18 + (long)iVar3);
          reorderRanges._4_4_ = (iVar4 - iVar3) / 4;
          while( true ) {
            bVar13 = false;
            if (reorderTable._4_4_ < reorderRanges._4_4_) {
              bVar13 = (piStack_68[(reorderRanges._4_4_ - reorderTable._4_4_) + -1] & 0xffff0000U)
                       != 0;
            }
            if (!bVar13) break;
            reorderTable._4_4_ = reorderTable._4_4_ + 1;
          }
          if (reorderTable._4_4_ != 0) {
            reorderRanges._4_4_ = reorderRanges._4_4_ - reorderTable._4_4_;
            puStack_78 = (uint32_t *)(piStack_68 + reorderRanges._4_4_);
          }
        }
        data = (CollationData *)0x0;
        iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,6);
        iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,7);
        if (0xff < iVar4 - iVar3) {
          if (reorderRanges._4_4_ == 0) {
            *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
            return (ssize_t)in_R8;
          }
          data = (CollationData *)((long)puStack_18 + (long)iVar3);
        }
        if ((local_448 == (CollationData *)0x0) ||
           (local_448->numericPrimary == (puStack_18[1] & 0xff000000))) {
          _commonSecTer = (CollationData *)0x0;
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,7);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,8);
          if (iVar4 - iVar3 < 8) {
            if (local_448 == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            in_RCX->data = local_448;
          }
          else {
            UVar2 = CollationTailoring::ensureOwnedData(in_RCX,(UErrorCode *)in_R8);
            if (UVar2 == '\0') {
              return CONCAT71(extraout_var_00,UVar2);
            }
            _commonSecTer = in_RCX->ownedData;
            _commonSecTer->base = local_448;
            _commonSecTer->numericPrimary = puStack_18[1] & 0xff000000;
            pUVar9 = utrie2_openFromSerialized_63
                               (UTRIE2_32_VALUE_BITS,(void *)((long)puStack_18 + (long)iVar3),
                                iVar4 - iVar3,(int32_t *)0x0,(UErrorCode *)in_R8);
            in_RCX->trie = pUVar9;
            _commonSecTer->trie = pUVar9;
            UVar2 = ::U_FAILURE(*(UErrorCode *)
                                 &(in_R8->super_SharedObject).super_UObject._vptr_UObject);
            if (UVar2 != '\0') {
              return CONCAT71(extraout_var_01,UVar2);
            }
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,9);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,10);
          if (7 < iVar4 - iVar3) {
            if (_commonSecTer == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->ces = (int64_t *)((long)puStack_18 + (long)iVar3);
            _commonSecTer->cesLength = (iVar4 - iVar3) / 8;
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xb);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xc);
          if (3 < iVar4 - iVar3) {
            if (_commonSecTer == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->ce32s = (uint32_t *)((long)puStack_18 + (long)iVar3);
            _commonSecTer->ce32sLength = (iVar4 - iVar3) / 4;
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,4);
          if (iVar3 < 0) {
            if (_commonSecTer != (CollationData *)0x0) {
              if (local_448 == (CollationData *)0x0) {
                *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
                return (ssize_t)in_R8;
              }
              _commonSecTer->jamoCE32s = local_448->jamoCE32s;
            }
          }
          else {
            if ((_commonSecTer == (CollationData *)0x0) || (_commonSecTer->ce32s == (uint32_t *)0x0)
               ) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->jamoCE32s = _commonSecTer->ce32s + iVar3;
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xc);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xd);
          if (3 < iVar4 - iVar3) {
            iVar5 = (iVar4 - iVar3) / 4;
            if ((_commonSecTer == (CollationData *)0x0) || (iVar5 < 5)) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->rootElements = (uint32_t *)((long)puStack_18 + (long)iVar3);
            _commonSecTer->rootElementsLength = iVar5;
            if (_commonSecTer->rootElements[3] != 0x5000500) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            if (_commonSecTer->rootElements[4] >> 0x18 < 0x45) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xd);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xe);
          if (1 < iVar4 - iVar3) {
            if (_commonSecTer == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->contexts = (UChar *)((long)puStack_18 + (long)iVar3);
            _commonSecTer->contextsLength = (iVar4 - iVar3) / 2;
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xe);
          size = (size_t)uVar1;
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xf);
          if (iVar4 - iVar3 < 2) {
            if (_commonSecTer != (CollationData *)0x0) {
              if (local_448 == (CollationData *)0x0) {
                *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
                return (ssize_t)in_R8;
              }
              _commonSecTer->unsafeBackwardSet = local_448->unsafeBackwardSet;
            }
          }
          else {
            if (_commonSecTer == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            if (local_448 == (CollationData *)0x0) {
              pUVar10 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,size);
              local_458 = (UnicodeSet *)0x0;
              if (pUVar10 != (UnicodeSet *)0x0) {
                UnicodeSet::UnicodeSet
                          (pUVar10,unsafe_serializedData,0x352,kSerialized,(UErrorCode *)in_R8);
                local_458 = pUVar10;
              }
              in_RCX->unsafeBackwardSet = local_458;
              if (in_RCX->unsafeBackwardSet == (UnicodeSet *)0x0) {
                *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 7;
                return (ssize_t)in_R8;
              }
              UVar2 = ::U_FAILURE(*(UErrorCode *)
                                   &(in_R8->super_SharedObject).super_UObject._vptr_UObject);
              if (UVar2 != '\0') {
                return CONCAT71(extraout_var_02,UVar2);
              }
            }
            else {
              pUVar10 = (UnicodeSet *)UnicodeSet::cloneAsThawed(local_448->unsafeBackwardSet);
              in_RCX->unsafeBackwardSet = pUVar10;
              if (in_RCX->unsafeBackwardSet == (UnicodeSet *)0x0) {
                *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 7;
                return (ssize_t)in_R8;
              }
            }
            _i = (uint16_t *)((long)puStack_18 + (long)iVar3);
            UVar2 = uset_getSerializedSet_63((USerializedSet *)&unsafeData,_i,(iVar4 - iVar3) / 2);
            if (UVar2 == '\0') {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            start = uset_getSerializedRangeCount_63((USerializedSet *)&unsafeData);
            for (end = 0; end < start; end = end + 1) {
              uset_getSerializedRange_63
                        ((USerializedSet *)&unsafeData,end,&c,&stack0xffffffffffffff08);
              UnicodeSet::add(in_RCX->unsafeBackwardSet,c,UStack_f8);
            }
            scripts._4_4_ = 0x10000;
            for (scripts._2_2_ = 0xd800; scripts._2_2_ < 0xdc00; scripts._2_2_ = scripts._2_2_ + 1)
            {
              UVar2 = UnicodeSet::containsNone
                                (in_RCX->unsafeBackwardSet,scripts._4_4_,scripts._4_4_ + 0x3ff);
              if (UVar2 == '\0') {
                UnicodeSet::add(in_RCX->unsafeBackwardSet,(uint)scripts._2_2_);
              }
              scripts._4_4_ = scripts._4_4_ + 0x400;
            }
            UnicodeSet::freeze(in_RCX->unsafeBackwardSet);
            _commonSecTer->unsafeBackwardSet = in_RCX->unsafeBackwardSet;
          }
          if (_commonSecTer != (CollationData *)0x0) {
            _commonSecTer->fastLatinTable = (uint16_t *)0x0;
            _commonSecTer->fastLatinTableLength = 0;
            if (((int)puStack_18[1] >> 0x10 & 0xffU) == 2) {
              iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0xf);
              iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0x10);
              if (iVar4 - iVar3 < 2) {
                if (local_448 != (CollationData *)0x0) {
                  _commonSecTer->fastLatinTable = local_448->fastLatinTable;
                  _commonSecTer->fastLatinTableLength = local_448->fastLatinTableLength;
                }
              }
              else {
                _commonSecTer->fastLatinTable = (uint16_t *)((long)puStack_18 + (long)iVar3);
                _commonSecTer->fastLatinTableLength = (iVar4 - iVar3) / 2;
                if ((int)(uint)*_commonSecTer->fastLatinTable >> 8 != 2) {
                  *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
                  return (ssize_t)in_R8;
                }
              }
            }
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0x10);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0x11);
          if (iVar4 - iVar3 < 2) {
            if ((_commonSecTer != (CollationData *)0x0) && (local_448 != (CollationData *)0x0)) {
              _commonSecTer->numScripts = local_448->numScripts;
              _commonSecTer->scriptsIndex = local_448->scriptsIndex;
              _commonSecTer->scriptStarts = local_448->scriptStarts;
              _commonSecTer->scriptStartsLength = local_448->scriptStartsLength;
            }
          }
          else {
            if (_commonSecTer == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            puVar11 = (ushort *)((long)puStack_18 + (long)iVar3);
            _commonSecTer->numScripts = (uint)*puVar11;
            _commonSecTer->scriptStartsLength =
                 (iVar4 - iVar3) / 2 - (_commonSecTer->numScripts + 0x11);
            if ((_commonSecTer->scriptStartsLength < 3) ||
               (0x100 < _commonSecTer->scriptStartsLength)) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->scriptsIndex = puVar11 + 1;
            _commonSecTer->scriptStarts = puVar11 + (long)_commonSecTer->numScripts + 0x11;
            if (((*_commonSecTer->scriptStarts != 0) || (_commonSecTer->scriptStarts[1] != 0x300))
               || (_commonSecTer->scriptStarts[_commonSecTer->scriptStartsLength + -1] != 0xff00)) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
          }
          iVar3 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0x11);
          iVar4 = anon_unknown_10::getIndex((int32_t *)puStack_18,uVar1,0x12);
          if (iVar4 - iVar3 < 0x100) {
            if (_commonSecTer != (CollationData *)0x0) {
              if (local_448 == (CollationData *)0x0) {
                *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
                return (ssize_t)in_R8;
              }
              _commonSecTer->compressibleBytes = local_448->compressibleBytes;
            }
          }
          else {
            if (_commonSecTer == (CollationData *)0x0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              return (ssize_t)in_R8;
            }
            _commonSecTer->compressibleBytes = (UBool *)((long)puStack_18 + (long)iVar3);
          }
          pCVar12 = in_RCX->settings;
          uVar1 = puStack_18[1];
          uVar6 = CollationFastLatin::getOptions(in_RCX->data,pCVar12,local_428,0x180);
          if (((((uVar1 & 0xffff) == pCVar12->options) && (pCVar12->variableTop != 0)) &&
              ((reorderRanges._4_4_ == pCVar12->reorderCodesLength &&
               ((reorderRanges._4_4_ == 0 ||
                (iVar5 = memcmp(piStack_68,pCVar12->reorderCodes,(long)(reorderRanges._4_4_ << 2)),
                iVar5 == 0)))))) && (uVar6 == pCVar12->fastLatinOptions)) {
            if ((int)uVar6 < 0) {
              return (ulong)uVar6;
            }
            iVar5 = memcmp(local_428,pCVar12->fastLatinPrimaries,0x300);
            if (iVar5 == 0) {
              return CONCAT44(extraout_var_03,iVar5);
            }
          }
          pCVar12 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&in_RCX->settings);
          if (pCVar12 == (CollationSettings *)0x0) {
            *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 7;
            pCVar12 = in_R8;
          }
          else {
            pCVar12->options = uVar1 & 0xffff;
            this = in_RCX->data;
            MVar7 = CollationSettings::getMaxVariable(pCVar12);
            uVar8 = CollationData::getLastPrimaryForGroup(this,MVar7 + 0x1000);
            pCVar12->variableTop = uVar8;
            if (pCVar12->variableTop == 0) {
              *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
              pCVar12 = in_R8;
            }
            else {
              if (reorderRanges._4_4_ != 0) {
                CollationSettings::aliasReordering
                          (pCVar12,local_448,piStack_68,reorderRanges._4_4_,puStack_78,
                           reorderTable._4_4_,(uint8_t *)data,(UErrorCode *)in_R8);
              }
              iVar3 = CollationFastLatin::getOptions
                                (in_RCX->data,pCVar12,pCVar12->fastLatinPrimaries,0x180);
              pCVar12->fastLatinOptions = iVar3;
            }
          }
        }
        else {
          *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
        }
      }
      else {
        *(undefined4 *)&(in_R8->super_SharedObject).super_UObject._vptr_UObject = 3;
      }
    }
  }
  return (ssize_t)pCVar12;
}

Assistant:

void
CollationDataReader::read(const CollationTailoring *base, const uint8_t *inBytes, int32_t inLength,
                          CollationTailoring &tailoring, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(base != NULL) {
        if(inBytes == NULL || (0 <= inLength && inLength < 24)) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        const DataHeader *header = reinterpret_cast<const DataHeader *>(inBytes);
        if(!(header->dataHeader.magic1 == 0xda && header->dataHeader.magic2 == 0x27 &&
                isAcceptable(tailoring.version, NULL, NULL, &header->info))) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        if(base->getUCAVersion() != tailoring.getUCAVersion()) {
            errorCode = U_COLLATOR_VERSION_MISMATCH;
            return;
        }
        int32_t headerLength = header->dataHeader.headerSize;
        inBytes += headerLength;
        if(inLength >= 0) {
            inLength -= headerLength;
        }
    }

    if(inBytes == NULL || (0 <= inLength && inLength < 8)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    const int32_t *inIndexes = reinterpret_cast<const int32_t *>(inBytes);
    int32_t indexesLength = inIndexes[IX_INDEXES_LENGTH];
    if(indexesLength < 2 || (0 <= inLength && inLength < indexesLength * 4)) {
        errorCode = U_INVALID_FORMAT_ERROR;  // Not enough indexes.
        return;
    }

    // Assume that the tailoring data is in initial state,
    // with NULL pointers and 0 lengths.

    // Set pointers to non-empty data parts.
    // Do this in order of their byte offsets. (Should help porting to Java.)

    int32_t index;  // one of the indexes[] slots
    int32_t offset;  // byte offset for the index part
    int32_t length;  // number of bytes in the index part

    if(indexesLength > IX_TOTAL_SIZE) {
        length = inIndexes[IX_TOTAL_SIZE];
    } else if(indexesLength > IX_REORDER_CODES_OFFSET) {
        length = inIndexes[indexesLength - 1];
    } else {
        length = 0;  // only indexes, and inLength was already checked for them
    }
    if(0 <= inLength && inLength < length) {
        errorCode = U_INVALID_FORMAT_ERROR;
        return;
    }

    const CollationData *baseData = base == NULL ? NULL : base->data;
    const int32_t *reorderCodes = NULL;
    int32_t reorderCodesLength = 0;
    const uint32_t *reorderRanges = NULL;
    int32_t reorderRangesLength = 0;
    index = IX_REORDER_CODES_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 4) {
        if(baseData == NULL) {
            // We assume for collation settings that
            // the base data does not have a reordering.
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        reorderCodes = reinterpret_cast<const int32_t *>(inBytes + offset);
        reorderCodesLength = length / 4;

        // The reorderRanges (if any) are the trailing reorderCodes entries.
        // Split the array at the boundary.
        // Script or reorder codes do not exceed 16-bit values.
        // Range limits are stored in the upper 16 bits, and are never 0.
        while(reorderRangesLength < reorderCodesLength &&
                (reorderCodes[reorderCodesLength - reorderRangesLength - 1] & 0xffff0000) != 0) {
            ++reorderRangesLength;
        }
        U_ASSERT(reorderRangesLength < reorderCodesLength);
        if(reorderRangesLength != 0) {
            reorderCodesLength -= reorderRangesLength;
            reorderRanges = reinterpret_cast<const uint32_t *>(reorderCodes + reorderCodesLength);
        }
    }

    // There should be a reorder table only if there are reorder codes.
    // However, when there are reorder codes the reorder table may be omitted to reduce
    // the data size.
    const uint8_t *reorderTable = NULL;
    index = IX_REORDER_TABLE_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 256) {
        if(reorderCodesLength == 0) {
            errorCode = U_INVALID_FORMAT_ERROR;  // Reordering table without reordering codes.
            return;
        }
        reorderTable = inBytes + offset;
    } else {
        // If we have reorder codes, then build the reorderTable at the end,
        // when the CollationData is otherwise complete.
    }

    if(baseData != NULL && baseData->numericPrimary != (inIndexes[IX_OPTIONS] & 0xff000000)) {
        errorCode = U_INVALID_FORMAT_ERROR;
        return;
    }
    CollationData *data = NULL;  // Remains NULL if there are no mappings.

    index = IX_TRIE_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 8) {
        if(!tailoring.ensureOwnedData(errorCode)) { return; }
        data = tailoring.ownedData;
        data->base = baseData;
        data->numericPrimary = inIndexes[IX_OPTIONS] & 0xff000000;
        data->trie = tailoring.trie = utrie2_openFromSerialized(
            UTRIE2_32_VALUE_BITS, inBytes + offset, length, NULL,
            &errorCode);
        if(U_FAILURE(errorCode)) { return; }
    } else if(baseData != NULL) {
        // Use the base data. Only the settings are tailored.
        tailoring.data = baseData;
    } else {
        errorCode = U_INVALID_FORMAT_ERROR;  // No mappings.
        return;
    }

    index = IX_CES_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 8) {
        if(data == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;  // Tailored ces without tailored trie.
            return;
        }
        data->ces = reinterpret_cast<const int64_t *>(inBytes + offset);
        data->cesLength = length / 8;
    }

    index = IX_CE32S_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 4) {
        if(data == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;  // Tailored ce32s without tailored trie.
            return;
        }
        data->ce32s = reinterpret_cast<const uint32_t *>(inBytes + offset);
        data->ce32sLength = length / 4;
    }

    int32_t jamoCE32sStart = getIndex(inIndexes, indexesLength, IX_JAMO_CE32S_START);
    if(jamoCE32sStart >= 0) {
        if(data == NULL || data->ce32s == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;  // Index into non-existent ce32s[].
            return;
        }
        data->jamoCE32s = data->ce32s + jamoCE32sStart;
    } else if(data == NULL) {
        // Nothing to do.
    } else if(baseData != NULL) {
        data->jamoCE32s = baseData->jamoCE32s;
    } else {
        errorCode = U_INVALID_FORMAT_ERROR;  // No Jamo CE32s for Hangul processing.
        return;
    }

    index = IX_ROOT_ELEMENTS_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 4) {
        length /= 4;
        if(data == NULL || length <= CollationRootElements::IX_SEC_TER_BOUNDARIES) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        data->rootElements = reinterpret_cast<const uint32_t *>(inBytes + offset);
        data->rootElementsLength = length;
        uint32_t commonSecTer = data->rootElements[CollationRootElements::IX_COMMON_SEC_AND_TER_CE];
        if(commonSecTer != Collation::COMMON_SEC_AND_TER_CE) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        uint32_t secTerBoundaries = data->rootElements[CollationRootElements::IX_SEC_TER_BOUNDARIES];
        if((secTerBoundaries >> 24) < CollationKeys::SEC_COMMON_HIGH) {
            // [fixed last secondary common byte] is too low,
            // and secondary weights would collide with compressed common secondaries.
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
    }

    index = IX_CONTEXTS_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 2) {
        if(data == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;  // Tailored contexts without tailored trie.
            return;
        }
        data->contexts = reinterpret_cast<const UChar *>(inBytes + offset);
        data->contextsLength = length / 2;
    }

    index = IX_UNSAFE_BWD_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 2) {
        if(data == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        if(baseData == NULL) {
#if defined(COLLUNSAFE_COLL_VERSION) && defined (COLLUNSAFE_SERIALIZE)
          tailoring.unsafeBackwardSet = new UnicodeSet(unsafe_serializedData, unsafe_serializedCount, UnicodeSet::kSerialized, errorCode);
          if(tailoring.unsafeBackwardSet == NULL) {
            errorCode = U_MEMORY_ALLOCATION_ERROR;
            return;
          } else if (U_FAILURE(errorCode)) {
            return;
          }
#else
            // Create the unsafe-backward set for the root collator.
            // Include all non-zero combining marks and trail surrogates.
            // We do this at load time, rather than at build time,
            // to simplify Unicode version bootstrapping:
            // The root data builder only needs the new FractionalUCA.txt data,
            // but it need not be built with a version of ICU already updated to
            // the corresponding new Unicode Character Database.
            //
            // The following is an optimized version of
            // new UnicodeSet("[[:^lccc=0:][\\udc00-\\udfff]]").
            // It is faster and requires fewer code dependencies.
            tailoring.unsafeBackwardSet = new UnicodeSet(0xdc00, 0xdfff);  // trail surrogates
            if(tailoring.unsafeBackwardSet == NULL) {
                errorCode = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            data->nfcImpl.addLcccChars(*tailoring.unsafeBackwardSet);
#endif // !COLLUNSAFE_SERIALIZE || !COLLUNSAFE_COLL_VERSION
        } else {
            // Clone the root collator's set contents.
            tailoring.unsafeBackwardSet = static_cast<UnicodeSet *>(
                baseData->unsafeBackwardSet->cloneAsThawed());
            if(tailoring.unsafeBackwardSet == NULL) {
                errorCode = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
        }
        // Add the ranges from the data file to the unsafe-backward set.
        USerializedSet sset;
        const uint16_t *unsafeData = reinterpret_cast<const uint16_t *>(inBytes + offset);
        if(!uset_getSerializedSet(&sset, unsafeData, length / 2)) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        int32_t count = uset_getSerializedRangeCount(&sset);
        for(int32_t i = 0; i < count; ++i) {
            UChar32 start, end;
            uset_getSerializedRange(&sset, i, &start, &end);
            tailoring.unsafeBackwardSet->add(start, end);
        }
        // Mark each lead surrogate as "unsafe"
        // if any of its 1024 associated supplementary code points is "unsafe".
        UChar32 c = 0x10000;
        for(UChar lead = 0xd800; lead < 0xdc00; ++lead, c += 0x400) {
            if(!tailoring.unsafeBackwardSet->containsNone(c, c + 0x3ff)) {
                tailoring.unsafeBackwardSet->add(lead);
            }
        }
        tailoring.unsafeBackwardSet->freeze();
        data->unsafeBackwardSet = tailoring.unsafeBackwardSet;
    } else if(data == NULL) {
        // Nothing to do.
    } else if(baseData != NULL) {
        // No tailoring-specific data: Alias the root collator's set.
        data->unsafeBackwardSet = baseData->unsafeBackwardSet;
    } else {
        errorCode = U_INVALID_FORMAT_ERROR;  // No unsafeBackwardSet.
        return;
    }

    // If the fast Latin format version is different,
    // or the version is set to 0 for "no fast Latin table",
    // then just always use the normal string comparison path.
    if(data != NULL) {
        data->fastLatinTable = NULL;
        data->fastLatinTableLength = 0;
        if(((inIndexes[IX_OPTIONS] >> 16) & 0xff) == CollationFastLatin::VERSION) {
            index = IX_FAST_LATIN_TABLE_OFFSET;
            offset = getIndex(inIndexes, indexesLength, index);
            length = getIndex(inIndexes, indexesLength, index + 1) - offset;
            if(length >= 2) {
                data->fastLatinTable = reinterpret_cast<const uint16_t *>(inBytes + offset);
                data->fastLatinTableLength = length / 2;
                if((*data->fastLatinTable >> 8) != CollationFastLatin::VERSION) {
                    errorCode = U_INVALID_FORMAT_ERROR;  // header vs. table version mismatch
                    return;
                }
            } else if(baseData != NULL) {
                data->fastLatinTable = baseData->fastLatinTable;
                data->fastLatinTableLength = baseData->fastLatinTableLength;
            }
        }
    }

    index = IX_SCRIPTS_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 2) {
        if(data == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        const uint16_t *scripts = reinterpret_cast<const uint16_t *>(inBytes + offset);
        int32_t scriptsLength = length / 2;
        data->numScripts = scripts[0];
        // There must be enough entries for both arrays, including more than two range starts.
        data->scriptStartsLength = scriptsLength - (1 + data->numScripts + 16);
        if(data->scriptStartsLength <= 2 ||
                CollationData::MAX_NUM_SCRIPT_RANGES < data->scriptStartsLength) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        data->scriptsIndex = scripts + 1;
        data->scriptStarts = scripts + 1 + data->numScripts + 16;
        if(!(data->scriptStarts[0] == 0 &&
                data->scriptStarts[1] == ((Collation::MERGE_SEPARATOR_BYTE + 1) << 8) &&
                data->scriptStarts[data->scriptStartsLength - 1] ==
                        (Collation::TRAIL_WEIGHT_BYTE << 8))) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
    } else if(data == NULL) {
        // Nothing to do.
    } else if(baseData != NULL) {
        data->numScripts = baseData->numScripts;
        data->scriptsIndex = baseData->scriptsIndex;
        data->scriptStarts = baseData->scriptStarts;
        data->scriptStartsLength = baseData->scriptStartsLength;
    }

    index = IX_COMPRESSIBLE_BYTES_OFFSET;
    offset = getIndex(inIndexes, indexesLength, index);
    length = getIndex(inIndexes, indexesLength, index + 1) - offset;
    if(length >= 256) {
        if(data == NULL) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return;
        }
        data->compressibleBytes = reinterpret_cast<const UBool *>(inBytes + offset);
    } else if(data == NULL) {
        // Nothing to do.
    } else if(baseData != NULL) {
        data->compressibleBytes = baseData->compressibleBytes;
    } else {
        errorCode = U_INVALID_FORMAT_ERROR;  // No compressibleBytes[].
        return;
    }

    const CollationSettings &ts = *tailoring.settings;
    int32_t options = inIndexes[IX_OPTIONS] & 0xffff;
    uint16_t fastLatinPrimaries[CollationFastLatin::LATIN_LIMIT];
    int32_t fastLatinOptions = CollationFastLatin::getOptions(
            tailoring.data, ts, fastLatinPrimaries, UPRV_LENGTHOF(fastLatinPrimaries));
    if(options == ts.options && ts.variableTop != 0 &&
            reorderCodesLength == ts.reorderCodesLength &&
            (reorderCodesLength == 0 ||
                uprv_memcmp(reorderCodes, ts.reorderCodes, reorderCodesLength * 4) == 0) &&
            fastLatinOptions == ts.fastLatinOptions &&
            (fastLatinOptions < 0 ||
                uprv_memcmp(fastLatinPrimaries, ts.fastLatinPrimaries,
                            sizeof(fastLatinPrimaries)) == 0)) {
        return;
    }

    CollationSettings *settings = SharedObject::copyOnWrite(tailoring.settings);
    if(settings == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    settings->options = options;
    // Set variableTop from options and scripts data.
    settings->variableTop = tailoring.data->getLastPrimaryForGroup(
            UCOL_REORDER_CODE_FIRST + settings->getMaxVariable());
    if(settings->variableTop == 0) {
        errorCode = U_INVALID_FORMAT_ERROR;
        return;
    }

    if(reorderCodesLength != 0) {
        settings->aliasReordering(*baseData, reorderCodes, reorderCodesLength,
                                  reorderRanges, reorderRangesLength,
                                  reorderTable, errorCode);
    }

    settings->fastLatinOptions = CollationFastLatin::getOptions(
        tailoring.data, *settings,
        settings->fastLatinPrimaries, UPRV_LENGTHOF(settings->fastLatinPrimaries));
}